

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jishmo.c
# Opt level: O2

int decode_packet(AVPacket *pkt)

{
  long lVar1;
  int iVar2;
  int iVar3;
  FILE *pFVar4;
  long lVar5;
  ulong uVar6;
  short *psVar7;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  short *psVar11;
  short *psVar12;
  short *psVar13;
  undefined8 *puVar14;
  size_t sStack_1e0;
  short *local_1d0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  char szFileName [255];
  
  iVar3 = avcodec_send_packet(video_dec_ctx);
  memset(szFileName,0,0xff);
  pFVar4 = _stderr;
  if (iVar3 < 0) {
    puVar14 = &local_178;
    local_178 = 0;
    uStack_170 = 0;
    local_168 = 0;
    uStack_160 = 0;
    local_158 = 0;
    uStack_150 = 0;
    local_148 = 0;
    uStack_140 = 0;
    av_strerror(iVar3,puVar14,0x40);
    pcVar9 = "Error while sending a packet to the decoder: %s\n";
LAB_00101c49:
    fprintf(pFVar4,pcVar9,puVar14);
  }
  else {
    while ((iVar3 = avcodec_receive_frame(video_dec_ctx,frame), pFVar4 = _stderr,
           iVar3 != -0x20464f45 && (iVar3 != -0xb))) {
      if (iVar3 < 0) {
        puVar14 = &local_1b8;
        local_1b8 = 0;
        uStack_1b0 = 0;
        local_1a8 = 0;
        uStack_1a0 = 0;
        local_198 = 0;
        uStack_190 = 0;
        local_188 = 0;
        uStack_180 = 0;
        av_strerror(iVar3,puVar14,0x40);
        pcVar9 = "Error while receiving a frame from the decoder: %s\n";
        goto LAB_00101c49;
      }
      video_frame_count = video_frame_count + 1;
      sprintf(szFileName,"./output/mv/%d.json");
      pFVar4 = fopen(szFileName,"w");
      if (pFVar4 == (FILE *)0x0) {
        fwrite("Couldn\'t open file for reading\n",0x1f,1,_stderr);
        exit(1);
      }
      fwrite("[\n",2,1,pFVar4);
      lVar5 = av_frame_get_side_data(frame,8);
      if (lVar5 != 0) {
        lVar1 = *(long *)(lVar5 + 8);
        psVar13 = (short *)(lVar1 + 6);
        for (uVar8 = 0; uVar6 = (ulong)(long)*(int *)(lVar5 + 0x10) / 0x28, uVar8 < uVar6;
            uVar8 = uVar8 + 1) {
          lVar10 = uVar8 * 0x28 + lVar1;
          fwrite("\t{\n",3,1,pFVar4);
          fprintf(pFVar4,"\t\t\"source\" : %d,\n",(ulong)*(uint *)(psVar13 + -3));
          fprintf(pFVar4,"\t\t\"width\" : %d,\n",(ulong)*(byte *)(psVar13 + -1));
          fprintf(pFVar4,"\t\t\"height\" : %d,\n",(ulong)*(byte *)((long)psVar13 + -1));
          iVar3 = *(int *)(psVar13 + -3);
          if (uVar8 == uVar6 - 1) {
            if (iVar3 < 0) {
              fprintf(pFVar4,"\t\t\"src_x\" : %d,\n",(long)(int)*psVar13 / (long)-iVar3 & 0xffffffff
                     );
              local_1d0 = psVar13 + 1;
              iVar3 = *(int *)(psVar13 + -3);
              iVar2 = -iVar3;
              if (0 < iVar3) {
                iVar2 = iVar3;
              }
              fprintf(pFVar4,"\t\t\"src_y\" : %d,\n",
                      (long)(int)psVar13[1] / (long)iVar2 & 0xffffffff);
              psVar7 = psVar13 + 2;
              iVar3 = *(int *)(psVar13 + -3);
              iVar2 = -iVar3;
              if (0 < iVar3) {
                iVar2 = iVar3;
              }
              fprintf(pFVar4,"\t\t\"dst_x\" : %d,\n",
                      (long)(int)psVar13[2] / (long)iVar2 & 0xffffffff);
              psVar11 = psVar13 + 3;
              psVar12 = psVar13;
            }
            else {
              fprintf(pFVar4,"\t\t\"src_x\" : %d,\n",
                      (long)(int)psVar13[2] / (long)iVar3 & 0xffffffff);
              local_1d0 = (short *)(lVar10 + 0xc);
              iVar3 = *(int *)(psVar13 + -3);
              iVar2 = -iVar3;
              if (0 < iVar3) {
                iVar2 = iVar3;
              }
              fprintf(pFVar4,"\t\t\"src_y\" : %d,\n",
                      (long)(int)psVar13[3] / (long)iVar2 & 0xffffffff);
              psVar7 = (short *)(lVar10 + 6);
              iVar3 = *(int *)(psVar13 + -3);
              iVar2 = -iVar3;
              if (0 < iVar3) {
                iVar2 = iVar3;
              }
              fprintf(pFVar4,"\t\t\"dst_x\" : %d,\n",(long)(int)*psVar13 / (long)iVar2 & 0xffffffff)
              ;
              psVar11 = (short *)(lVar10 + 8);
              psVar12 = (short *)(lVar10 + 10);
            }
            iVar3 = *(int *)(psVar13 + -3);
            iVar2 = -iVar3;
            if (0 < iVar3) {
              iVar2 = iVar3;
            }
            fprintf(pFVar4,"\t\t\"dst_y\" : %d,\n",(long)(int)*psVar11 / (long)iVar2 & 0xffffffff);
            iVar3 = *(int *)(psVar13 + -3);
            iVar2 = -iVar3;
            if (0 < iVar3) {
              iVar2 = iVar3;
            }
            fprintf(pFVar4,"\t\t\"dx\" : %d,\n",
                    (long)((int)*psVar7 - (int)*psVar12) / (long)iVar2 & 0xffffffff);
            iVar3 = *(int *)(psVar13 + -3);
            iVar2 = -iVar3;
            if (0 < iVar3) {
              iVar2 = iVar3;
            }
            fprintf(pFVar4,"\t\t\"dy\" : %d\n",
                    (long)((int)*psVar11 - (int)*local_1d0) / (long)iVar2 & 0xffffffff);
            pcVar9 = "\t}\n";
            sStack_1e0 = 3;
          }
          else {
            if (iVar3 < 0) {
              fprintf(pFVar4,"\t\t\"src_x\" : %d,\n",(long)(int)*psVar13 / (long)-iVar3 & 0xffffffff
                     );
              local_1d0 = psVar13 + 1;
              iVar3 = *(int *)(psVar13 + -3);
              iVar2 = -iVar3;
              if (0 < iVar3) {
                iVar2 = iVar3;
              }
              fprintf(pFVar4,"\t\t\"src_y\" : %d,\n",
                      (long)(int)psVar13[1] / (long)iVar2 & 0xffffffff);
              psVar7 = psVar13 + 2;
              iVar3 = *(int *)(psVar13 + -3);
              iVar2 = -iVar3;
              if (0 < iVar3) {
                iVar2 = iVar3;
              }
              fprintf(pFVar4,"\t\t\"dst_x\" : %d,\n",
                      (long)(int)psVar13[2] / (long)iVar2 & 0xffffffff);
              psVar11 = psVar13 + 3;
              psVar12 = psVar13;
            }
            else {
              fprintf(pFVar4,"\t\t\"src_x\" : %d,\n",
                      (long)(int)psVar13[2] / (long)iVar3 & 0xffffffff);
              local_1d0 = (short *)(lVar10 + 0xc);
              iVar3 = *(int *)(psVar13 + -3);
              iVar2 = -iVar3;
              if (0 < iVar3) {
                iVar2 = iVar3;
              }
              fprintf(pFVar4,"\t\t\"src_y\" : %d,\n",
                      (long)(int)psVar13[3] / (long)iVar2 & 0xffffffff);
              psVar7 = (short *)(lVar10 + 6);
              iVar3 = *(int *)(psVar13 + -3);
              iVar2 = -iVar3;
              if (0 < iVar3) {
                iVar2 = iVar3;
              }
              fprintf(pFVar4,"\t\t\"dst_x\" : %d,\n",(long)(int)*psVar13 / (long)iVar2 & 0xffffffff)
              ;
              psVar11 = (short *)(lVar10 + 8);
              psVar12 = (short *)(lVar10 + 10);
            }
            iVar3 = *(int *)(psVar13 + -3);
            iVar2 = -iVar3;
            if (0 < iVar3) {
              iVar2 = iVar3;
            }
            fprintf(pFVar4,"\t\t\"dst_y\" : %d,\n",(long)(int)*psVar11 / (long)iVar2 & 0xffffffff);
            iVar3 = *(int *)(psVar13 + -3);
            iVar2 = -iVar3;
            if (0 < iVar3) {
              iVar2 = iVar3;
            }
            fprintf(pFVar4,"\t\t\"dx\" : %d,\n",
                    (long)((int)*psVar7 - (int)*psVar12) / (long)iVar2 & 0xffffffff);
            iVar3 = *(int *)(psVar13 + -3);
            iVar2 = -iVar3;
            if (0 < iVar3) {
              iVar2 = iVar3;
            }
            fprintf(pFVar4,"\t\t\"dy\" : %d\n",
                    (long)((int)*psVar11 - (int)*local_1d0) / (long)iVar2 & 0xffffffff);
            pcVar9 = "\t},\n";
            sStack_1e0 = 4;
          }
          fwrite(pcVar9,sStack_1e0,1,pFVar4);
          psVar13 = psVar13 + 0x14;
        }
      }
      fwrite("]\n",2,1,pFVar4);
      fclose(pFVar4);
      printf("\rTotal Processed Frames:%d",(ulong)(uint)video_frame_count);
      fflush(_stdout);
      av_frame_unref(frame);
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int decode_packet(const AVPacket *pkt)
{
    int ret = avcodec_send_packet(video_dec_ctx, pkt);
    char szFileName[255] = {0};
    FILE *file=NULL;
    if (ret < 0) {
        fprintf(stderr, "Error while sending a packet to the decoder: %s\n", av_err2str(ret));
        return ret;
    }

    while (ret >= 0)  {
        ret = avcodec_receive_frame(video_dec_ctx, frame);
        if (ret == AVERROR(EAGAIN) || ret == AVERROR_EOF) {
            break;
        } else if (ret < 0) {
            fprintf(stderr, "Error while receiving a frame from the decoder: %s\n", av_err2str(ret));
            return ret;
        }

        if (ret >= 0) {
            int i;
            AVFrameSideData *sd;
	    video_frame_count++;
            sprintf(szFileName, "./output/mv/%d.json", video_frame_count);
            file = fopen(szFileName,"w");
            if (file == NULL)
            {
                fprintf(stderr, "Couldn't open file for reading\n");
                exit(1);
            }
            fprintf(file, "[\n");
            sd = av_frame_get_side_data(frame, AV_FRAME_DATA_MOTION_VECTORS);
            if (sd) {
                const AVMotionVector *mvs = (const AVMotionVector *)sd->data;
                for (i = 0; i < sd->size / sizeof(*mvs); i++) {
                    const AVMotionVector *mv = &mvs[i];
                    // print_motion_vectors_data(mv, video_frame_count);
                    if(i==(sd->size / sizeof(*mvs))-1){
                      fprintf(file, "\t{\n");
                      fprintf(file, "\t\t\"source\" : %d,\n", mv->source);
                      fprintf(file, "\t\t\"width\" : %d,\n", mv->w);
                      fprintf(file, "\t\t\"height\" : %d,\n", mv->h);
                      if(mv->source<0){
                        fprintf(file, "\t\t\"src_x\" : %d,\n", ((mv->src_x)/abs(mv->source)));
                        fprintf(file, "\t\t\"src_y\" : %d,\n", (mv->src_y)/abs(mv->source));
                        fprintf(file, "\t\t\"dst_x\" : %d,\n", (mv->dst_x/abs(mv->source)));
                        fprintf(file, "\t\t\"dst_y\" : %d,\n", (mv->dst_y/abs(mv->source)));
                        fprintf(file, "\t\t\"dx\" : %d,\n", ((mv->dst_x - mv->src_x)/abs(mv->source)));
                        fprintf(file, "\t\t\"dy\" : %d\n", ((mv->dst_y - mv->src_y)/abs(mv->source)));
                      }else{
                        fprintf(file, "\t\t\"src_x\" : %d,\n", (mv->dst_x/abs(mv->source)));
                        fprintf(file, "\t\t\"src_y\" : %d,\n", (mv->dst_y/abs(mv->source)));
                        fprintf(file, "\t\t\"dst_x\" : %d,\n", (mv->src_x/abs(mv->source)));
                        fprintf(file, "\t\t\"dst_y\" : %d,\n", (mv->src_y/abs(mv->source)));
                        fprintf(file, "\t\t\"dx\" : %d,\n", ((mv->src_x - mv->dst_x)/abs(mv->source)));
                        fprintf(file, "\t\t\"dy\" : %d\n", ((mv->src_y - mv->dst_y)/abs(mv->source)));
                      }
                      fprintf(file, "\t}\n");
                    }else{
                      fprintf(file, "\t{\n");
                      fprintf(file, "\t\t\"source\" : %d,\n", mv->source);
                      fprintf(file, "\t\t\"width\" : %d,\n", mv->w);
                      fprintf(file, "\t\t\"height\" : %d,\n", mv->h);
                      if(mv->source<0){
                        fprintf(file, "\t\t\"src_x\" : %d,\n", (mv->src_x/abs(mv->source)));
                        fprintf(file, "\t\t\"src_y\" : %d,\n", (mv->src_y/abs(mv->source)));
                        fprintf(file, "\t\t\"dst_x\" : %d,\n", (mv->dst_x/abs(mv->source)));
                        fprintf(file, "\t\t\"dst_y\" : %d,\n", (mv->dst_y/abs(mv->source)));
                        fprintf(file, "\t\t\"dx\" : %d,\n", ((mv->dst_x - mv->src_x)/abs(mv->source)));
                        fprintf(file, "\t\t\"dy\" : %d\n", ((mv->dst_y - mv->src_y)/abs(mv->source)));
                      }else{
                        fprintf(file, "\t\t\"src_x\" : %d,\n", (mv->dst_x/abs(mv->source)));
                        fprintf(file, "\t\t\"src_y\" : %d,\n", (mv->dst_y/abs(mv->source)));
                        fprintf(file, "\t\t\"dst_x\" : %d,\n", (mv->src_x/abs(mv->source)));
                        fprintf(file, "\t\t\"dst_y\" : %d,\n", (mv->src_y/abs(mv->source)));
                        fprintf(file, "\t\t\"dx\" : %d,\n", ((mv->src_x - mv->dst_x)/abs(mv->source)));
                        fprintf(file, "\t\t\"dy\" : %d\n", ((mv->src_y - mv->dst_y)/abs(mv->source)));
                      }
                      fprintf(file, "\t},\n");
                    }
                }
                // printf("%s\n", strcat( "./output/", strcat(video_frame_count, ".json")));
            }
            fprintf(file, "]\n");
            fclose(file);
	    printf("\rTotal Processed Frames:%d", video_frame_count);
	    fflush(stdout);
            //Print frame data
            // print_frame_data(frame);
            av_frame_unref(frame);
        }
    }
    return 0;
}